

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::createTextureCall
          (Builder *this,Decoration precision,Id resultType,bool sparse,bool fetch,bool proj,
          bool gather,bool noImplicitLod,TextureParameters *parameters)

{
  int iVar1;
  bool bVar2;
  Decoration precision_00;
  Op OVar3;
  Id IVar4;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  uint uVar5;
  int op;
  Op OVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  Id IVar11;
  ulong uStack_90;
  Id local_84;
  Id local_80;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_78;
  Decoration local_6c;
  Id texArgs [10];
  
  texArgs[4] = 0;
  texArgs[5] = 0;
  texArgs[6] = 0;
  texArgs[7] = 0;
  texArgs[2] = 0;
  texArgs[3] = 0;
  texArgs[8] = 0;
  texArgs[9] = 0;
  texArgs[0] = parameters->sampler;
  texArgs[1] = parameters->coords;
  if (parameters->Dref == 0) {
    uStack_90 = 2;
  }
  else {
    texArgs[3] = 0;
    texArgs[2] = parameters->Dref;
    uStack_90 = 3;
  }
  uVar8 = uStack_90;
  if (parameters->component != 0) {
    uVar8 = (ulong)((int)uStack_90 + 1);
    texArgs[uStack_90] = parameters->component;
  }
  iVar1 = (int)uVar8;
  uVar10 = iVar1 + 1;
  IVar4 = parameters->bias;
  if (IVar4 != 0) {
    uVar7 = (ulong)uVar10;
    uVar10 = iVar1 + 2;
    texArgs[uVar7] = IVar4;
  }
  IVar11 = (Id)(IVar4 != 0);
  IVar4 = parameters->lod;
  local_6c = precision;
  if (IVar4 == 0) {
    if (parameters->gradX != 0) {
      IVar11 = IVar11 | 4;
      uVar5 = uVar10 + 1;
      texArgs[uVar10] = parameters->gradX;
      IVar4 = parameters->gradY;
      iVar9 = 2;
      goto LAB_0019a9ca;
    }
    if ((!fetch && !gather) && noImplicitLod) {
      IVar4 = makeFloatConstant(this,0.0,false);
      goto LAB_0019a9a2;
    }
    bVar2 = false;
  }
  else {
LAB_0019a9a2:
    IVar11 = IVar11 | 2;
    iVar9 = 1;
    uVar5 = uVar10;
LAB_0019a9ca:
    uVar10 = uVar10 + iVar9;
    texArgs[uVar5] = IVar4;
    bVar2 = true;
  }
  uVar5 = parameters->offset;
  if ((ulong)uVar5 != 0) {
    uVar7 = (ulong)(this->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5]->opCode;
    if ((uVar7 < 0x35) && ((0x1f7e0000000002U >> (uVar7 & 0x3f) & 1) != 0)) {
      IVar11 = IVar11 | 8;
    }
    else {
      addCapability(this,CapabilityImageGatherExtended);
      IVar11 = IVar11 | 0x10;
      uVar5 = parameters->offset;
    }
    uVar7 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    texArgs[uVar7] = uVar5;
  }
  if (parameters->offsets != 0) {
    IVar11 = IVar11 | 0x20;
    uVar7 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    texArgs[uVar7] = parameters->offsets;
  }
  if (parameters->sample != 0) {
    IVar11 = IVar11 | 0x40;
    uVar7 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    texArgs[uVar7] = parameters->sample;
  }
  if (parameters->lodClamp == 0) {
    if (IVar11 == 0) {
      uVar10 = uVar10 - 1;
      goto LAB_0019aa8d;
    }
  }
  else {
    addCapability(this,CapabilityMinLod);
    IVar11 = IVar11 | 0x80;
    uVar7 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    texArgs[uVar7] = parameters->lodClamp;
  }
  texArgs[uVar8] = IVar11;
LAB_0019aa8d:
  if (fetch) {
    OVar3 = OpImageSparseFetch;
    OVar6 = OpImageFetch;
  }
  else {
    IVar4 = parameters->Dref;
    if (gather) {
      if (IVar4 == 0) {
        OVar3 = OpImageSparseGather;
        OVar6 = OpImageGather;
      }
      else {
        OVar3 = OpImageSparseDrefGather;
        OVar6 = OpImageDrefGather;
      }
    }
    else if (bVar2) {
      if (IVar4 == 0) {
        if (proj) {
          OVar3 = OpImageSparseSampleProjExplicitLod;
          OVar6 = OpImageSampleProjExplicitLod;
        }
        else {
          OVar3 = OpImageSparseSampleExplicitLod;
          OVar6 = OpImageSampleExplicitLod;
        }
      }
      else if (proj) {
        OVar3 = OpImageSparseSampleProjDrefExplicitLod;
        OVar6 = OpImageSampleProjDrefExplicitLod;
      }
      else {
        OVar3 = OpImageSparseSampleDrefExplicitLod;
        OVar6 = OpImageSampleDrefExplicitLod;
      }
    }
    else if (IVar4 == 0) {
      if (proj) {
        OVar3 = OpImageSparseSampleProjImplicitLod;
        OVar6 = OpImageSampleProjImplicitLod;
      }
      else {
        OVar3 = OpImageSparseSampleImplicitLod;
        OVar6 = OpImageSampleImplicitLod;
      }
    }
    else if (proj) {
      OVar3 = OpImageSparseSampleProjDrefImplicitLod;
      OVar6 = OpImageSampleProjDrefImplicitLod;
    }
    else {
      OVar3 = OpImageSparseSampleDrefImplicitLod;
      OVar6 = OpImageSampleDrefImplicitLod;
    }
  }
  if (sparse) {
    OVar6 = OVar3;
  }
  IVar4 = resultType;
  if (((2 < (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start[resultType]->opCode - OpTypeBool) &&
      (OVar6 - OpImageSampleDrefImplicitLod < 6)) &&
     ((0x33U >> (OVar6 - OpImageSampleDrefImplicitLod & 0x1f) & 1) != 0)) {
    IVar4 = getScalarTypeId(this,resultType);
  }
  if (sparse) {
    local_80 = getDerefTypeId(this,parameters->texelOut);
    IVar11 = makeStructResultType(this,IVar4,local_80);
    local_84 = IVar4;
  }
  else {
    local_84 = 0;
    local_80 = 0;
    IVar11 = IVar4;
  }
  this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       dxil_spv::allocate_in_thread(0x38);
  IVar4 = this->uniqueId + 1;
  this->uniqueId = IVar4;
  *(undefined ***)
   this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001e31e0;
  *(Id *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar4;
  *(Id *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = IVar11;
  *(Op *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = OVar6;
  (((Vector<Id> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
  *(Block **)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = (Block *)0x0;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    Instruction::addIdOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,texArgs[uVar7]);
  }
  if (iVar1 < (int)uVar10) {
    Instruction::addImmediateOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,texArgs[uVar8]);
  }
  while (precision_00 = local_6c, uVar8 = uVar8 + 1, uVar8 < uVar10) {
    Instruction::addIdOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,texArgs[uVar8]);
  }
  setPrecision(this,*(Id *)((long)this_00.
                                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8
                           ),local_6c);
  local_78._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  Block::addInstruction
            (this->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_78);
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
      local_78._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    (**(code **)(*(long *)local_78._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
  }
  local_78._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
  IVar4 = *(Id *)((long)this_00.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
  if (sparse) {
    addCapability(this,CapabilitySparseResidency);
    IVar11 = createCompositeExtract(this,IVar4,local_80,1);
    createStore(this,IVar11,parameters->texelOut);
    IVar4 = createCompositeExtract(this,IVar4,local_84,0);
    setPrecision(this,IVar4,precision_00);
  }
  else if (IVar11 != resultType) {
    IVar4 = smearScalar(this,precision_00,IVar4,resultType);
  }
  return IVar4;
}

Assistant:

Id Builder::createTextureCall(Decoration precision, Id resultType, bool sparse, bool fetch, bool proj, bool gather, bool noImplicitLod, const TextureParameters& parameters)
{
    static const int maxTextureArgs = 10;
    Id texArgs[maxTextureArgs] = {};

    //
    // Set up the fixed arguments
    //
    int numArgs = 0;
    bool explicitLod = false;
    texArgs[numArgs++] = parameters.sampler;
    texArgs[numArgs++] = parameters.coords;
    if (parameters.Dref != NoResult)
        texArgs[numArgs++] = parameters.Dref;
    if (parameters.component != NoResult)
        texArgs[numArgs++] = parameters.component;

    //
    // Set up the optional arguments
    //
    int optArgNum = numArgs;                        // track which operand, if it exists, is the mask of optional arguments
    ++numArgs;                                      // speculatively make room for the mask operand
    ImageOperandsMask mask = ImageOperandsMaskNone; // the mask operand
    if (parameters.bias) {
        mask = (ImageOperandsMask)(mask | ImageOperandsBiasMask);
        texArgs[numArgs++] = parameters.bias;
    }
    if (parameters.lod) {
        mask = (ImageOperandsMask)(mask | ImageOperandsLodMask);
        texArgs[numArgs++] = parameters.lod;
        explicitLod = true;
    } else if (parameters.gradX) {
        mask = (ImageOperandsMask)(mask | ImageOperandsGradMask);
        texArgs[numArgs++] = parameters.gradX;
        texArgs[numArgs++] = parameters.gradY;
        explicitLod = true;
    } else if (noImplicitLod && ! fetch && ! gather) {
        // have to explicitly use lod of 0 if not allowed to have them be implicit, and
        // we would otherwise be about to issue an implicit instruction
        mask = (ImageOperandsMask)(mask | ImageOperandsLodMask);
        texArgs[numArgs++] = makeFloatConstant(0.0);
        explicitLod = true;
    }
    if (parameters.offset) {
        if (isConstant(parameters.offset))
            mask = (ImageOperandsMask)(mask | ImageOperandsConstOffsetMask);
        else {
            addCapability(CapabilityImageGatherExtended);
            mask = (ImageOperandsMask)(mask | ImageOperandsOffsetMask);
        }
        texArgs[numArgs++] = parameters.offset;
    }
    if (parameters.offsets) {
        mask = (ImageOperandsMask)(mask | ImageOperandsConstOffsetsMask);
        texArgs[numArgs++] = parameters.offsets;
    }
    if (parameters.sample) {
        mask = (ImageOperandsMask)(mask | ImageOperandsSampleMask);
        texArgs[numArgs++] = parameters.sample;
    }
    if (parameters.lodClamp) {
        // capability if this bit is used
        addCapability(CapabilityMinLod);

        mask = (ImageOperandsMask)(mask | ImageOperandsMinLodMask);
        texArgs[numArgs++] = parameters.lodClamp;
    }
    if (mask == ImageOperandsMaskNone)
        --numArgs;  // undo speculative reservation for the mask argument
    else
        texArgs[optArgNum] = mask;

    //
    // Set up the instruction
    //
    Op opCode = OpNop;  // All paths below need to set this
    if (fetch) {
        if (sparse)
            opCode = OpImageSparseFetch;
        else
            opCode = OpImageFetch;
    } else if (gather) {
        if (parameters.Dref)
            if (sparse)
                opCode = OpImageSparseDrefGather;
            else
                opCode = OpImageDrefGather;
        else
            if (sparse)
                opCode = OpImageSparseGather;
            else
                opCode = OpImageGather;
    } else if (explicitLod) {
        if (parameters.Dref) {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjDrefExplicitLod;
                else
                    opCode = OpImageSampleProjDrefExplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleDrefExplicitLod;
                else
                    opCode = OpImageSampleDrefExplicitLod;
        } else {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjExplicitLod;
                else
                    opCode = OpImageSampleProjExplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleExplicitLod;
                else
                    opCode = OpImageSampleExplicitLod;
        }
    } else {
        if (parameters.Dref) {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjDrefImplicitLod;
                else
                    opCode = OpImageSampleProjDrefImplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleDrefImplicitLod;
                else
                    opCode = OpImageSampleDrefImplicitLod;
        } else {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjImplicitLod;
                else
                    opCode = OpImageSampleProjImplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleImplicitLod;
                else
                    opCode = OpImageSampleImplicitLod;
        }
    }

    // See if the result type is expecting a smeared result.
    // This happens when a legacy shadow*() call is made, which
    // gets a vec4 back instead of a float.
    Id smearedType = resultType;
    if (! isScalarType(resultType)) {
        switch (opCode) {
        case OpImageSampleDrefImplicitLod:
        case OpImageSampleDrefExplicitLod:
        case OpImageSampleProjDrefImplicitLod:
        case OpImageSampleProjDrefExplicitLod:
            resultType = getScalarTypeId(resultType);
            break;
        default:
            break;
        }
    }

    Id typeId0 = 0;
    Id typeId1 = 0;

    if (sparse) {
        typeId0 = resultType;
        typeId1 = getDerefTypeId(parameters.texelOut);
        resultType = makeStructResultType(typeId0, typeId1);
    }

    // Build the SPIR-V instruction
    Instruction* textureInst = new Instruction(getUniqueId(), resultType, opCode);
    for (int op = 0; op < optArgNum; ++op)
        textureInst->addIdOperand(texArgs[op]);
    if (optArgNum < numArgs)
        textureInst->addImmediateOperand(texArgs[optArgNum]);
    for (int op = optArgNum + 1; op < numArgs; ++op)
        textureInst->addIdOperand(texArgs[op]);
    setPrecision(textureInst->getResultId(), precision);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(textureInst));

    Id resultId = textureInst->getResultId();

    if (sparse) {
        // set capability
        addCapability(CapabilitySparseResidency);

        // Decode the return type that was a special structure
        createStore(createCompositeExtract(resultId, typeId1, 1), parameters.texelOut);
        resultId = createCompositeExtract(resultId, typeId0, 0);
        setPrecision(resultId, precision);
    } else {
        // When a smear is needed, do it, as per what was computed
        // above when resultType was changed to a scalar type.
        if (resultType != smearedType)
            resultId = smearScalar(precision, resultId, smearedType);
    }

    return resultId;
}